

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AttributeRelativeOffsetCase::test
          (AttributeRelativeOffsetCase *this,ResultCollector *result)

{
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  uint uVar4;
  GLuint attribindex;
  deUint32 dVar5;
  undefined4 extraout_var;
  int iVar6;
  int attr;
  uint index;
  bool bVar7;
  allocator<char> local_149;
  ResultCollector *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  GLint maxAttrs;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ScopedLogSection section_1;
  string local_b0;
  CallLogWrapper gl;
  code *local_78;
  GLenum local_70;
  VertexArray otherVao;
  VertexArray vao;
  
  local_148 = result;
  iVar2 = (*((this->super_AttributeCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
             ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_AttributeCase).super_TestCase.m_context)->m_renderCtx);
  maxAttrs = -1;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glBindVertexArray(&gl,vao.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8869,&maxAttrs);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Got Error ",(allocator<char> *)&local_78);
    otherVao.super_ObjectWrapper.m_gl = (Functions *)glu::getErrorName;
    otherVao.super_ObjectWrapper.m_traits._0_4_ = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&otherVao);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_d8,&local_b0);
    std::operator+(&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_120,&local_140,"glGetIntegerv");
    tcu::ResultCollector::fail(local_148,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  pTVar1 = ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"initial",(allocator<char> *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Initial values",(allocator<char> *)&local_b0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  index = 0;
  while( true ) {
    uVar4 = maxAttrs;
    if (maxAttrs < 0x11) {
      uVar4 = 0x10;
    }
    if (uVar4 <= index) break;
    deqp::gls::StateQueryUtil::verifyStateAttributeInteger
              (local_148,&gl,0x82d5,index,0,(this->super_AttributeCase).m_verifier);
    index = index + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"vao",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"VAO state",(allocator<char> *)&local_d8);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&otherVao,((this->super_AttributeCase).super_TestCase.m_context)->m_renderCtx);
  glu::CallLogWrapper::glVertexAttribFormat(&gl,1,4,0x1406,'\0',9);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Got Error ",&local_149);
    local_78 = glu::getErrorName;
    local_70 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_d8,&local_b0);
    std::operator+(&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_120,&local_140,"glVertexAttribFormat");
    tcu::ResultCollector::fail(local_148,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  glu::CallLogWrapper::glBindVertexArray(&gl,otherVao.super_ObjectWrapper.m_object);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Got Error ",&local_149);
    local_78 = glu::getErrorName;
    local_70 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_d8,&local_b0);
    std::operator+(&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_120,&local_140,"glBindVertexArray");
    tcu::ResultCollector::fail(local_148,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  glu::CallLogWrapper::glVertexAttribFormat(&gl,1,4,0x1406,'\0',0x15);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Got Error ",&local_149);
    local_78 = glu::getErrorName;
    local_70 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_d8,&local_b0);
    std::operator+(&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_120,&local_140,"glVertexAttribFormat");
    tcu::ResultCollector::fail(local_148,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  glu::CallLogWrapper::glBindVertexArray(&gl,vao.super_ObjectWrapper.m_object);
  GVar3 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar3 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Got Error ",&local_149);
    local_78 = glu::getErrorName;
    local_70 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_d8,&local_b0);
    std::operator+(&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_120,&local_140,"glBindVertexArray");
    tcu::ResultCollector::fail(local_148,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  deqp::gls::StateQueryUtil::verifyStateAttributeInteger
            (local_148,&gl,0x82d5,1,9,(this->super_AttributeCase).m_verifier);
  glu::ObjectWrapper::~ObjectWrapper(&otherVao.super_ObjectWrapper);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = ((this->super_AttributeCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"random",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Random values",(allocator<char> *)&local_d8);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  deRandom_init((deRandom *)&otherVao,0xabc);
  iVar2 = 10;
  while( true ) {
    bVar7 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar7) break;
    iVar6 = maxAttrs;
    if (maxAttrs < 0x11) {
      iVar6 = 0x10;
    }
    attribindex = de::Random::getInt((Random *)&otherVao,0,iVar6 + -1);
    dVar5 = deRandom_getUint32((deRandom *)&otherVao);
    glu::CallLogWrapper::glVertexAttribFormat(&gl,attribindex,4,0x1406,'\0',dVar5 & 0x7ff);
    GVar3 = glu::CallLogWrapper::glGetError(&gl);
    if (GVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"Got Error ",&local_149);
      local_78 = glu::getErrorName;
      local_70 = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_78);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     &local_d8,&local_b0);
      std::operator+(&local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                     ": ");
      std::operator+(&local_120,&local_140,"glVertexAttribFormat");
      tcu::ResultCollector::fail(local_148,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&section);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    deqp::gls::StateQueryUtil::verifyStateAttributeInteger
              (local_148,&gl,0x82d5,attribindex,dVar5 & 0x7ff,(this->super_AttributeCase).m_verifier
              );
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return;
}

Assistant:

void AttributeRelativeOffsetCase::test (tcu::ResultCollector& result)
{
	glu::CallLogWrapper gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::VertexArray	vao			(m_context.getRenderContext());
	glw::GLint			maxAttrs	= -1;

	gl.enableLogging(true);

	gl.glBindVertexArray(*vao);
	gl.glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &maxAttrs);
	GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glGetIntegerv");

	// initial
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "initial", "Initial values");

		for (int attr = 0; attr < de::max(16, maxAttrs); ++attr)
			verifyStateAttributeInteger(result, gl, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, attr, 0, m_verifier);
	}

	// is part of vao
	{
		const tcu::ScopedLogSection section			(m_testCtx.getLog(), "vao", "VAO state");
		glu::VertexArray			otherVao		(m_context.getRenderContext());

		// set to value A in vao1
		gl.glVertexAttribFormat(1, 4, GL_FLOAT, GL_FALSE, 9);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glVertexAttribFormat");

		// set to value B in vao2
		gl.glBindVertexArray(*otherVao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		gl.glVertexAttribFormat(1, 4, GL_FLOAT, GL_FALSE, 21);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glVertexAttribFormat");

		// check value is still ok in original vao
		gl.glBindVertexArray(*vao);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindVertexArray");

		verifyStateAttributeInteger(result, gl, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, 1, 9, m_verifier);
	}

	// random values
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "random", "Random values");
		de::Random					rnd				(0xabc);
		const int					numRandomTests	= 10;

		for (int randomTestNdx = 0; randomTestNdx < numRandomTests; ++randomTestNdx)
		{
			const int	va				= rnd.getInt(0, de::max(16, maxAttrs)-1);
			const int	offset			= rnd.getInt(0, 2047);

			gl.glVertexAttribFormat(va, 4, GL_FLOAT, GL_FALSE, offset);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glVertexAttribFormat");

			verifyStateAttributeInteger(result, gl, GL_VERTEX_ATTRIB_RELATIVE_OFFSET, va, offset, m_verifier);
		}
	}
}